

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef BinaryenReturn(BinaryenModuleRef module,BinaryenExpressionRef value)

{
  Return *pRVar1;
  
  pRVar1 = MixedArena::alloc<wasm::Return>(&module->allocator);
  pRVar1->value = value;
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenReturn(BinaryenModuleRef module,
                                     BinaryenExpressionRef value) {
  auto* ret = Builder(*(Module*)module).makeReturn((Expression*)value);
  return static_cast<Expression*>(ret);
}